

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O0

void __thiscall efsw::DirectorySnapshot::setDirectoryInfo(DirectorySnapshot *this,string *directory)

{
  FileInfo local_60;
  string *local_18;
  string *directory_local;
  DirectorySnapshot *this_local;
  
  local_18 = directory;
  directory_local = (string *)this;
  FileInfo::FileInfo(&local_60,directory);
  FileInfo::operator=(&this->DirectoryInfo,&local_60);
  FileInfo::~FileInfo(&local_60);
  return;
}

Assistant:

void DirectorySnapshot::setDirectoryInfo( std::string directory ) {
	DirectoryInfo = FileInfo( directory );
}